

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_or_default_seek
                    (ma_vfs *pVFS,ma_vfs_file file,ma_int64 offset,ma_seek_origin origin)

{
  ma_result mVar1;
  undefined4 in_ECX;
  ma_vfs_file in_RDX;
  ma_vfs *in_RSI;
  ma_vfs_file in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI == (ma_vfs_file)0x0) {
    mVar1 = ma_default_vfs_seek(in_RSI,in_RDX,CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                ma_seek_origin_start);
  }
  else {
    mVar1 = ma_vfs_seek((ma_vfs *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI,(ma_int64)in_RSI,(ma_seek_origin)((ulong)in_RDX >> 0x20));
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_vfs_or_default_seek(ma_vfs* pVFS, ma_vfs_file file, ma_int64 offset, ma_seek_origin origin)
{
    if (pVFS != NULL) {
        return ma_vfs_seek(pVFS, file, offset, origin);
    } else {
        return ma_default_vfs_seek(pVFS, file, offset, origin);
    }
}